

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O3

cf_bool_t cf_file_exist(cf_char_t *filename)

{
  int iVar1;
  
  if (filename != (cf_char_t *)0x0) {
    iVar1 = access(filename,0);
    return (uint)(iVar1 == 0);
  }
  return 0;
}

Assistant:

cf_bool_t   cf_file_exist(const cf_char_t* filename) {
    if(!filename) return CF_FALSE;
#ifdef CF_OS_WIN
    return _access(filename, 0) == 0 ? CF_TRUE : CF_FALSE;
#else
    return access(filename, 0) == 0 ? CF_TRUE : CF_FALSE;
#endif
}